

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_attribute_struct **ppxVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  xml_allocator *this_00;
  char_t *pcVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  xml_memory_page *page;
  void *pvVar10;
  xml_attribute_struct **ppxVar11;
  xml_attribute_struct *pxVar12;
  
  pxVar2 = this->_root;
  if ((pxVar2 == (xml_node_struct *)0x0) ||
     (pxVar3 = a->_attr, pxVar3 == (xml_attribute_struct *)0x0)) {
    return false;
  }
  ppxVar1 = &pxVar2->first_attribute;
  ppxVar11 = ppxVar1;
  do {
    pxVar4 = *ppxVar11;
    if (pxVar4 == pxVar3) break;
    ppxVar11 = &pxVar4->next_attribute;
  } while (pxVar4 != (xml_attribute_struct *)0x0);
  if (pxVar4 == (xml_attribute_struct *)0x0) {
    bVar8 = false;
  }
  else {
    pxVar4 = pxVar3->prev_attribute_c;
    pxVar5 = pxVar3->next_attribute;
    pxVar12 = pxVar5;
    if (pxVar5 == (xml_attribute_struct *)0x0) {
      pxVar12 = *ppxVar1;
    }
    this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
    pxVar12->prev_attribute_c = pxVar4;
    page = (xml_memory_page *)&pxVar4->next_attribute;
    if (pxVar4->next_attribute == (xml_attribute_struct *)0x0) {
      page = (xml_memory_page *)ppxVar1;
    }
    page->allocator = (xml_allocator *)pxVar5;
    pxVar3->prev_attribute_c = (xml_attribute_struct *)0x0;
    pxVar3->next_attribute = (xml_attribute_struct *)0x0;
    pxVar3 = a->_attr;
    uVar9 = pxVar3->header;
    if ((uVar9 & 0x20) != 0) {
      pcVar6 = pxVar3->name;
      page = (xml_memory_page *)((ulong)*(ushort *)(pcVar6 + -4) * 8);
      lVar7 = (ulong)*(ushort *)(pcVar6 + -4) * -8;
      if (*(ushort *)(pcVar6 + -2) == 0) {
        pvVar10 = *(void **)(pcVar6 + lVar7 + -0x14);
      }
      else {
        pvVar10 = (void *)((ulong)*(ushort *)(pcVar6 + -2) << 3);
      }
      impl::anon_unknown_0::xml_allocator::deallocate_memory
                (this_00,pvVar10,(size_t)(pcVar6 + lVar7 + -0x2c),page);
      uVar9 = pxVar3->header;
    }
    if ((uVar9 & 0x10) != 0) {
      pcVar6 = pxVar3->value;
      page = (xml_memory_page *)((ulong)*(ushort *)(pcVar6 + -4) * 8);
      lVar7 = (ulong)*(ushort *)(pcVar6 + -4) * -8;
      if (*(ushort *)(pcVar6 + -2) == 0) {
        pvVar10 = *(void **)(pcVar6 + lVar7 + -0x14);
      }
      else {
        pvVar10 = (void *)((ulong)*(ushort *)(pcVar6 + -2) << 3);
      }
      impl::anon_unknown_0::xml_allocator::deallocate_memory
                (this_00,pvVar10,(size_t)(pcVar6 + lVar7 + -0x2c),page);
      uVar9 = pxVar3->header;
    }
    impl::anon_unknown_0::xml_allocator::deallocate_memory
              (this_00,(void *)0x28,(long)pxVar3 - (uVar9 >> 8),page);
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

PUGI_IMPL_FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;
		if (!impl::is_attribute_of(a._attr, _root)) return false;

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		impl::remove_attribute(a._attr, _root);
		impl::destroy_attribute(a._attr, alloc);

		return true;
	}